

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_numeric_suite.cpp
# Opt level: O0

void numeric_suite::test_adjacent_difference_back_inserter(void)

{
  int *this;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  iterator iVar1;
  iterator iVar2;
  back_insert_iterator<vista::circular_array<int,_4UL>_> __result;
  iterator first_begin;
  iterator first_end;
  allocator<int> local_e1;
  int local_e0 [4];
  iterator local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<int,_std::allocator<int>_> expect;
  undefined1 local_88 [8];
  circular_array<int,_4UL> result;
  allocator<int> local_49;
  int local_48 [6];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> data;
  
  local_48[0] = 0xb;
  local_48[1] = 0x16;
  local_48[2] = 0x21;
  local_48[3] = 0x2c;
  local_48[4] = 0x37;
  local_30 = local_48;
  local_28 = 5;
  std::allocator<int>::allocator(&local_49);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l_00,&local_49);
  std::allocator<int>::~allocator(&local_49);
  vista::circular_array<int,_4UL>::circular_array((circular_array<int,_4UL> *)local_88);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  iVar2 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_20)
  ;
  __result = std::back_inserter<vista::circular_array<int,4ul>>
                       ((circular_array<int,_4UL> *)local_88);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                adjacent_difference<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<vista::circular_array<int,4ul>>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           iVar1._M_current,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           iVar2._M_current,__result);
  local_e0[0] = 0xb;
  local_e0[1] = 0xb;
  local_e0[2] = 0xb;
  local_e0[3] = 0xb;
  local_d0 = local_e0;
  local_c8 = 4;
  std::allocator<int>::allocator(&local_e1);
  __l._M_len = local_c8;
  __l._M_array = local_d0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c0,__l,&local_e1);
  std::allocator<int>::~allocator(&local_e1);
  this = result.super_array<int,_4UL>._M_elems + 2;
  first_begin = vista::circular_view<int,_4UL>::begin((circular_view<int,_4UL> *)this);
  first_end = vista::circular_view<int,_4UL>::end((circular_view<int,_4UL> *)this);
  iVar1 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_c0);
  iVar2 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_c0)
  ;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_numeric_suite.cpp"
             ,0x34,"void numeric_suite::test_adjacent_difference_back_inserter()",first_begin,
             first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void test_adjacent_difference_back_inserter()
{
    std::vector<int> data = {11, 22, 33, 44, 55};
    circular_array<int, 4> result;
    std::adjacent_difference(data.begin(), data.end(), std::back_inserter(result));
    std::vector<int> expect = {22 - 11, 33 - 22, 44 - 33, 55 - 44};
    BOOST_TEST_ALL_EQ(result.begin(), result.end(), expect.begin(), expect.end());
}